

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int utfchar(lua_State *L)

{
  int iVar1;
  int iVar2;
  luaL_Buffer b;
  
  iVar1 = lua_gettop(L);
  if (iVar1 == 1) {
    pushutfchar(L,1);
  }
  else {
    luaL_buffinit(L,&b);
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    for (iVar1 = 1; iVar1 - iVar2 != 1; iVar1 = iVar1 + 1) {
      pushutfchar(L,iVar1);
      luaL_addvalue(&b);
    }
    luaL_pushresult(&b);
  }
  return 1;
}

Assistant:

static int utfchar (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  if (n == 1)  /* optimize common case of single char */
    pushutfchar(L, 1);
  else {
    int i;
    luaL_Buffer b;
    luaL_buffinit(L, &b);
    for (i = 1; i <= n; i++) {
      pushutfchar(L, i);
      luaL_addvalue(&b);
    }
    luaL_pushresult(&b);
  }
  return 1;
}